

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cSparseTextureTests.cpp
# Opt level: O0

bool __thiscall
gl4cts::SparseTextureCommitmentTestCase::verifyInvalidValueErrors
          (SparseTextureCommitmentTestCase *this,Functions *gl,GLint target,GLint format,
          GLuint *texture)

{
  GLenum GVar1;
  bool local_39;
  bool result;
  GLuint *texture_local;
  GLint format_local;
  GLint target_local;
  Functions *gl_local;
  SparseTextureCommitmentTestCase *this_local;
  
  std::operator<<((ostream *)&this->field_0x88,"Verify INVALID_VALUE Errors - ");
  (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[8])
            (this,gl,(ulong)(uint)target,(ulong)(uint)format,texture,1);
  (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[5])
            (this,gl,(ulong)(uint)target,(ulong)(uint)format,texture,0,1,0,0,
             (this->mState).pageSizeX,(this->mState).pageSizeY,(this->mState).pageSizeZ,1);
  GVar1 = (*gl->getError)();
  local_39 = SparseTextureUtils::verifyError
                       (&this->mLog,
                        "texPageCommitment [commitment offsetX not multiple of page size X]",GVar1,
                        0x501);
  if (local_39) {
    (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[5])
              (this,gl,(ulong)(uint)target,(ulong)(uint)format,texture,0,0,1,0,
               (this->mState).pageSizeX,(this->mState).pageSizeY,(this->mState).pageSizeZ,1);
    GVar1 = (*gl->getError)();
    local_39 = SparseTextureUtils::verifyError
                         (&this->mLog,
                          "texPageCommitment [commitment offsetY not multiple of page size Y]",GVar1
                          ,0x501);
    if ((local_39) && (((target == 0x806f || (target == 0x8c1a)) || (target == 0x9009)))) {
      (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[5])
                (this,gl,(ulong)(uint)target,(ulong)(uint)format,texture,0,0,0,
                 (this->mState).minDepth,(this->mState).pageSizeX,(this->mState).pageSizeY,
                 (this->mState).pageSizeZ,1);
      GVar1 = (*gl->getError)();
      local_39 = SparseTextureUtils::verifyError
                           (&this->mLog,
                            "texPageCommitment [commitment offsetZ not multiple of page size Z]",
                            GVar1,0x501);
    }
  }
  gl4cts::Texture::Delete(gl,texture);
  return local_39;
}

Assistant:

bool SparseTextureCommitmentTestCase::verifyInvalidValueErrors(const Functions& gl, GLint target, GLint format,
															   GLuint& texture)
{
	mLog << "Verify INVALID_VALUE Errors - ";

	bool result = true;

	sparseAllocateTexture(gl, target, format, texture, 1);

	// Case 1 - commitment offset not multiple of page size in corresponding dimension
	texPageCommitment(gl, target, format, texture, 0, 1, 0, 0, mState.pageSizeX, mState.pageSizeY, mState.pageSizeZ,
					  GL_TRUE);
	result = SparseTextureUtils::verifyError(mLog, "texPageCommitment [commitment offsetX not multiple of page size X]",
											 gl.getError(), GL_INVALID_VALUE);
	if (!result)
		goto verifing_invalid_value_end;

	texPageCommitment(gl, target, format, texture, 0, 0, 1, 0, mState.pageSizeX, mState.pageSizeY, mState.pageSizeZ,
					  GL_TRUE);
	result = SparseTextureUtils::verifyError(mLog, "texPageCommitment [commitment offsetY not multiple of page size Y]",
											 gl.getError(), GL_INVALID_VALUE);
	if (!result)
		goto verifing_invalid_value_end;

	if (target == GL_TEXTURE_3D || target == GL_TEXTURE_2D_ARRAY || target == GL_TEXTURE_CUBE_MAP_ARRAY)
	{
		texPageCommitment(gl, target, format, texture, 0, 0, 0, mState.minDepth, mState.pageSizeX, mState.pageSizeY,
						  mState.pageSizeZ, GL_TRUE);
		result =
			SparseTextureUtils::verifyError(mLog, "texPageCommitment [commitment offsetZ not multiple of page size Z]",
											gl.getError(), GL_INVALID_VALUE);
		if (!result)
			goto verifing_invalid_value_end;
	}

verifing_invalid_value_end:

	Texture::Delete(gl, texture);

	return result;
}